

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O0

uint32_t simdjson::internal::detect_supported_architectures(void)

{
  uint local_1c;
  uint32_t local_18;
  uint32_t host_isa;
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  
  local_1c = 0;
  ecx = 7;
  host_isa = 0;
  cpuid(&ecx,&edx,&host_isa,&local_18);
  if ((edx & 0x20) != 0) {
    local_1c = 4;
  }
  if ((edx & 8) != 0) {
    local_1c = local_1c | 0x20;
  }
  if ((edx & 0x100) != 0) {
    local_1c = local_1c | 0x40;
  }
  ecx = 1;
  cpuid(&ecx,&edx,&host_isa,&local_18);
  if ((host_isa & 0x100000) != 0) {
    local_1c = local_1c | 8;
  }
  if ((host_isa & 2) != 0) {
    local_1c = local_1c | 0x10;
  }
  return local_1c;
}

Assistant:

static inline uint32_t detect_supported_architectures() {
  uint32_t eax, ebx, ecx, edx;
  uint32_t host_isa = 0x0;

  // ECX for EAX=0x7
  eax = 0x7;
  ecx = 0x0;
  cpuid(&eax, &ebx, &ecx, &edx);
  if (ebx & cpuid_avx2_bit) {
    host_isa |= instruction_set::AVX2;
  }
  if (ebx & cpuid_bmi1_bit) {
    host_isa |= instruction_set::BMI1;
  }

  if (ebx & cpuid_bmi2_bit) {
    host_isa |= instruction_set::BMI2;
  }

  // EBX for EAX=0x1
  eax = 0x1;
  cpuid(&eax, &ebx, &ecx, &edx);

  if (ecx & cpuid_sse42_bit) {
    host_isa |= instruction_set::SSE42;
  }

  if (ecx & cpuid_pclmulqdq_bit) {
    host_isa |= instruction_set::PCLMULQDQ;
  }

  return host_isa;
}